

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentVarData.cpp
# Opt level: O2

void __thiscall license::locate::EnvironmentVarData::~EnvironmentVarData(EnvironmentVarData *this)

{
  LocatorStrategy::~LocatorStrategy(&this->super_LocatorStrategy);
  operator_delete(this);
  return;
}

Assistant:

EnvironmentVarData::~EnvironmentVarData() {}